

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O2

int DummyWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  void *pvVar5;
  
  (*Svcs->verbose)(*(void **)((long)Handle_v + 0x10),5,
                   "Waiting for completion of memory read to rank %d, condition %d\n",
                   (ulong)*(uint *)((long)Handle_v + 0x20),(ulong)*Handle_v);
  iVar3 = CMCondition_wait(*(undefined8 *)((long)Handle_v + 8),*Handle_v);
  if (iVar3 == 0) {
    pvVar5 = *(void **)((long)Handle_v + 0x10);
    uVar2 = *(uint *)((long)Handle_v + 0x20);
    uVar1 = *Handle_v;
    pcVar4 = 
    "Remote memory read to rank %d with condition %d has FAILED because of writer failure\n";
  }
  else {
    uVar1 = *Handle_v;
    if (uVar1 == 0xffffffff) goto LAB_006b83ca;
    pvVar5 = *(void **)((long)Handle_v + 0x10);
    uVar2 = *(uint *)((long)Handle_v + 0x20);
    pcVar4 = "Remote memory read to rank %d with condition %d has completed\n";
  }
  (*Svcs->verbose)(pvVar5,5,pcVar4,(ulong)uVar2,(ulong)uVar1);
LAB_006b83ca:
  free(Handle_v);
  return iVar3;
}

Assistant:

static int DummyWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    DummyCompletionHandle Handle = (DummyCompletionHandle)Handle_v;
    int Ret;
    Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                  "Waiting for completion of memory read to rank %d, condition %d\n", Handle->Rank,
                  Handle->CMcondition);
    /*
     * Wait for the CM condition to be signalled.  If it has been already,
     * this returns immediately.  Copying the incoming data to the waiting
     * buffer has been done by the reply handler.
     */
    Ret = CMCondition_wait(Handle->cm, Handle->CMcondition);
    if (!Ret)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Remote memory read to rank %d with "
                      "condition %d has FAILED because of "
                      "writer failure\n",
                      Handle->Rank, Handle->CMcondition);
    }
    else
    {
        if (Handle->CMcondition != -1)
            Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                          "Remote memory read to rank %d with condition %d has "
                          "completed\n",
                          Handle->Rank, Handle->CMcondition);
    }
    free(Handle);
    return Ret;
}